

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandSeqSweep(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  Fra_Ssw_t Pars;
  Fra_Ssw_t local_84;
  Abc_Frame_t *local_40;
  Abc_Ntk_t *local_38;
  
  local_40 = pAbc;
  local_38 = Abc_FrameReadNtk(pAbc);
  local_84.nPartSize = 0;
  local_84.nOverSize = 0;
  local_84.nFramesP = 0;
  local_84.nFramesK = 1;
  local_84.nMaxImps = 5000;
  local_84.nMaxLevs = 0;
  local_84.TimeLimit = 0.0;
  local_84.fUseImps = 0;
  local_84.fRewrite = 0;
  local_84.fFraiging = 0;
  local_84.fLatchCorr = 0;
  local_84.fWriteImps = 0;
  local_84.fUse1Hot = 0;
  local_84.fVerbose = 0;
  Extra_UtilGetoptReset();
LAB_00217bd3:
  while (iVar1 = Extra_UtilGetopt(argc,argv,"PQNFILirfletvh"), iVar6 = globalUtilOptind, 100 < iVar1
        ) {
    if (iVar1 < 0x72) {
      if (7 < iVar1 - 0x65U) goto switchD_00217c09_caseD_67;
      piVar3 = &local_84.fUseImps;
      switch(iVar1) {
      case 0x65:
        piVar3 = &local_84.fWriteImps;
        break;
      case 0x66:
        piVar3 = &local_84.fFraiging;
        break;
      default:
        goto switchD_00217c09_caseD_67;
      case 0x69:
        break;
      case 0x6c:
        piVar3 = &local_84.fLatchCorr;
      }
    }
    else {
      piVar3 = &local_84.fRewrite;
      if ((iVar1 != 0x72) && (piVar3 = &local_84.fUse1Hot, iVar1 != 0x74)) {
        if (iVar1 != 0x76) goto switchD_00217c09_caseD_67;
        piVar3 = &local_84.fVerbose;
      }
    }
    *(byte *)piVar3 = (byte)*piVar3 ^ 1;
  }
  switch(iVar1) {
  case 0x46:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      local_84.nFramesK = iVar1;
LAB_00217d1f:
      globalUtilOptind = iVar6 + 1;
      if (iVar1 < 1) goto switchD_00217c09_caseD_67;
      goto LAB_00217bd3;
    }
    pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x47:
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4f:
    goto switchD_00217c09_caseD_67;
  case 0x49:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      local_84.nMaxImps = iVar1;
      goto LAB_00217d1f;
    }
    pcVar4 = "Command line switch \"-I\" should be followed by an integer.\n";
    break;
  case 0x4c:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      local_84.nMaxLevs = iVar1;
      goto LAB_00217d1f;
    }
    pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
    break;
  case 0x4e:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_84.nFramesP = uVar2;
LAB_00217cd8:
      globalUtilOptind = iVar6 + 1;
      if ((int)uVar2 < 0) goto switchD_00217c09_caseD_67;
      goto LAB_00217bd3;
    }
    pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
    break;
  case 0x50:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-P\" should be followed by an integer.\n";
      break;
    }
    local_84.nPartSize = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar6 + 1;
    if (local_84.nPartSize < 2) {
switchD_00217c09_caseD_67:
      Abc_Print(-2,"usage: ssweep [-PQNFL <num>] [-lrfetvh]\n");
      Abc_Print(-2,"\t         performs sequential sweep using K-step induction\n");
      Abc_Print(-2,"\t-P num : max partition size (0 = no partitioning) [default = %d]\n",
                (ulong)(uint)local_84.nPartSize);
      Abc_Print(-2,"\t-Q num : partition overlap (0 = no overlap) [default = %d]\n",
                (ulong)(uint)local_84.nOverSize);
      Abc_Print(-2,"\t-N num : number of time frames to use as the prefix [default = %d]\n",
                local_84._8_8_ & 0xffffffff);
      Abc_Print(-2,"\t-F num : number of time frames for induction (1=simple) [default = %d]\n",
                (ulong)local_84._8_8_ >> 0x20);
      Abc_Print(-2,"\t-L num : max number of levels to consider (0=all) [default = %d]\n",
                (ulong)local_84._16_8_ >> 0x20);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_84.fLatchCorr == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-l     : toggle latch correspondence only [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_84.fRewrite == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle AIG rewriting [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_84.fFraiging == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-f     : toggle fraiging (combinational SAT sweeping) [default = %s]\n",pcVar4
               );
      pcVar4 = "yes";
      if (local_84.fWriteImps == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-e     : toggle writing implications as assertions [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_84.fUse1Hot == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle using one-hotness conditions [default = %s]\n",pcVar4);
      if (local_84.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar6 = -2;
LAB_00217f75:
      Abc_Print(iVar6,pcVar4);
      return 1;
    }
    goto LAB_00217bd3;
  case 0x51:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_84.nOverSize = uVar2;
      goto LAB_00217cd8;
    }
    pcVar4 = "Command line switch \"-Q\" should be followed by an integer.\n";
    break;
  default:
    if (iVar1 == -1) {
      if (local_38 == (Abc_Ntk_t *)0x0) {
        pcVar4 = "Empty network.\n";
      }
      else {
        if (local_38->nObjCounts[8] == 0) {
          pcVar4 = "The network is combinational (run \"fraig\" or \"fraig_sweep\").\n";
LAB_00217fc2:
          Abc_Print(-1,pcVar4);
          return 0;
        }
        if (local_38->ntkType != ABC_NTK_STRASH) {
          pcVar4 = "This command works only for structrally hashed networks. Run \"st\".\n";
          goto LAB_00217fc2;
        }
        if (local_84.fUse1Hot != 0 && 1 < local_84.nFramesK) {
          pcVar4 = "Currrently can only use one-hotness for simple induction (K=1).\n";
          goto LAB_00217fc2;
        }
        if (local_84.nFramesP != 0 && local_84.fUse1Hot != 0) {
          pcVar4 = "Currrently can only use one-hotness without prefix.\n";
          goto LAB_00217fc2;
        }
        pNtk = Abc_NtkDarSeqSweep(local_38,&local_84);
        if (pNtk != (Abc_Ntk_t *)0x0) {
          Abc_FrameReplaceCurrentNetwork(local_40,pNtk);
          return 0;
        }
        pcVar4 = "Sequential sweeping has failed.\n";
      }
      iVar6 = -1;
      goto LAB_00217f75;
    }
    goto switchD_00217c09_caseD_67;
  }
  Abc_Print(-1,pcVar4);
  goto switchD_00217c09_caseD_67;
}

Assistant:

int Abc_CommandSeqSweep( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    Fra_Ssw_t Pars, * pPars = &Pars;
    int c;
    extern Abc_Ntk_t * Abc_NtkDarSeqSweep( Abc_Ntk_t * pNtk, Fra_Ssw_t * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    pPars->nPartSize  = 0;
    pPars->nOverSize  = 0;
    pPars->nFramesP   = 0;
    pPars->nFramesK   = 1;
    pPars->nMaxImps   = 5000;
    pPars->nMaxLevs   = 0;
    pPars->fUseImps   = 0;
    pPars->fRewrite   = 0;
    pPars->fFraiging  = 0;
    pPars->fLatchCorr = 0;
    pPars->fWriteImps = 0;
    pPars->fUse1Hot   = 0;
    pPars->fVerbose   = 0;
    pPars->TimeLimit  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PQNFILirfletvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nPartSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nPartSize < 2 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nOverSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nOverSize < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesP = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesP < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesK = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesK <= 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMaxImps = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMaxImps <= 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMaxLevs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMaxLevs <= 0 )
                goto usage;
            break;
        case 'i':
            pPars->fUseImps ^= 1;
            break;
        case 'r':
            pPars->fRewrite ^= 1;
            break;
        case 'f':
            pPars->fFraiging ^= 1;
            break;
        case 'l':
            pPars->fLatchCorr ^= 1;
            break;
        case 'e':
            pPars->fWriteImps ^= 1;
            break;
        case 't':
            pPars->fUse1Hot ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "The network is combinational (run \"fraig\" or \"fraig_sweep\").\n" );
        return 0;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for structrally hashed networks. Run \"st\".\n" );
        return 0;
    }

    if ( pPars->nFramesK > 1 && pPars->fUse1Hot )
    {
        Abc_Print( -1, "Currrently can only use one-hotness for simple induction (K=1).\n" );
        return 0;
    }

    if ( pPars->nFramesP && pPars->fUse1Hot )
    {
        Abc_Print( -1, "Currrently can only use one-hotness without prefix.\n" );
        return 0;
    }

    // get the new network
    pNtkRes = Abc_NtkDarSeqSweep( pNtk, pPars );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Sequential sweeping has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: ssweep [-PQNFL <num>] [-lrfetvh]\n" );
    Abc_Print( -2, "\t         performs sequential sweep using K-step induction\n" );
    Abc_Print( -2, "\t-P num : max partition size (0 = no partitioning) [default = %d]\n", pPars->nPartSize );
    Abc_Print( -2, "\t-Q num : partition overlap (0 = no overlap) [default = %d]\n", pPars->nOverSize );
    Abc_Print( -2, "\t-N num : number of time frames to use as the prefix [default = %d]\n", pPars->nFramesP );
    Abc_Print( -2, "\t-F num : number of time frames for induction (1=simple) [default = %d]\n", pPars->nFramesK );
    Abc_Print( -2, "\t-L num : max number of levels to consider (0=all) [default = %d]\n", pPars->nMaxLevs );
//    Abc_Print( -2, "\t-I num : max number of implications to consider [default = %d]\n", pPars->nMaxImps );
//    Abc_Print( -2, "\t-i     : toggle using implications [default = %s]\n", pPars->fUseImps? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle latch correspondence only [default = %s]\n", pPars->fLatchCorr? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle AIG rewriting [default = %s]\n", pPars->fRewrite? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle fraiging (combinational SAT sweeping) [default = %s]\n", pPars->fFraiging? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle writing implications as assertions [default = %s]\n", pPars->fWriteImps? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle using one-hotness conditions [default = %s]\n", pPars->fUse1Hot? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}